

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void __thiscall
IR::Opnd::GetAddrDescription
          (Opnd *this,char16 *description,size_t count,bool AsmDumpMode,bool printToConsole,
          Func *func)

{
  AddrOpnd *pAVar1;
  undefined7 in_register_00000009;
  char16 *local_48;
  char16 *buffer;
  size_t n;
  
  n._4_4_ = (undefined4)CONCAT71(in_register_00000009,AsmDumpMode);
  local_48 = description;
  buffer = (char16 *)count;
  pAVar1 = AsAddrOpnd(this);
  if (pAVar1->decodedValue == (void *)0x0) {
    GetAddrDescription(description,count,pAVar1->m_address,pAVar1->addrOpndKind,false,printToConsole
                       ,func,false);
  }
  else {
    GetAddrDescription(description,count,pAVar1->decodedValue,pAVar1->addrOpndKind,false,
                       printToConsole,func,false);
    if (n._4_1_ == '\0') {
      WriteToBuffer(&local_48,(size_t *)&buffer,L" [encoded: 0x%08X",pAVar1->m_address);
    }
    else {
      WriteToBuffer(&local_48,(size_t *)&buffer,L" [encoded]");
    }
  }
  description[count - 1] = L'\0';
  return;
}

Assistant:

void
Opnd::GetAddrDescription(__out_ecount(count) char16 *const description, const size_t count, bool AsmDumpMode,
                         bool printToConsole, Func *func)
{
    char16 *buffer = description;
    size_t n = count;

    IR::AddrOpnd * addrOpnd = this->AsAddrOpnd();
    Js::Var address;

    bool isEncoded = false;
    if (addrOpnd->decodedValue != 0)
    {
        address = addrOpnd->decodedValue;
        isEncoded = true;
    }
    else
    {
        address = addrOpnd->m_address;
    }

    GetAddrDescription(description, count, address, addrOpnd->GetAddrOpndKind(), AsmDumpMode, printToConsole, func);

    if (isEncoded)
    {
        if (AsmDumpMode)
        {
            WriteToBuffer(&buffer, &n, _u(" [encoded]"));
        }
        else
        {
            WriteToBuffer(&buffer, &n, _u(" [encoded: 0x%08X"), addrOpnd->m_address);
        }
    }

    description[count-1] = 0;  // force null termination
}